

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O2

void __thiscall QTabBar::removeTab(QTabBar *this,int index)

{
  undefined1 *rect;
  SelectionBehavior SVar1;
  int iVar2;
  QTabBarPrivate *this_00;
  Tab *this_01;
  Tab **ppTVar3;
  long lVar4;
  long lVar5;
  Tab *pTVar6;
  long lVar7;
  uint uVar8;
  int *piVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  QRect QVar14;
  int index_local;
  int local_34;
  
  if (index < 0) {
    return;
  }
  this_00 = *(QTabBarPrivate **)&(this->super_QWidget).field_0x8;
  uVar12 = (ulong)(uint)index;
  if ((ulong)(this_00->tabList).d.size <= uVar12) {
    return;
  }
  this_01 = (this_00->tabList).d.ptr[uVar12];
  pTVar6 = this_01;
  index_local = index;
  if ((this_00->field_0x2d1 & 2) != 0) {
    QTabBarPrivate::moveTabFinished(this_00,this_00->pressedIndex);
    pTVar6 = (this_00->tabList).d.ptr[uVar12];
  }
  QWidget::releaseShortcut(&this->super_QWidget,pTVar6->shortcutId);
  if (this_01->leftWidget != (QWidget *)0x0) {
    QWidget::hide(this_01->leftWidget);
    QObject::deleteLater();
    this_01->leftWidget = (QWidget *)0x0;
  }
  if (this_01->rightWidget != (QWidget *)0x0) {
    QWidget::hide(this_01->rightWidget);
    QObject::deleteLater();
    this_01->rightWidget = (QWidget *)0x0;
  }
  uVar8 = this_01->lastTab;
  QList<QTabBarPrivate::Tab_*>::removeAt(&this_00->tabList,uVar12);
  QTabBarPrivate::Tab::~Tab(this_01);
  operator_delete(this_01,0xf0);
  ppTVar3 = (this_00->tabList).d.ptr;
  lVar4 = (this_00->tabList).d.size;
  for (lVar7 = 0; lVar4 << 3 != lVar7; lVar7 = lVar7 + 8) {
    lVar5 = *(long *)((long)ppTVar3 + lVar7);
    iVar10 = *(int *)(lVar5 + 0xdc);
    bVar13 = iVar10 == index;
    if (bVar13) {
      iVar10 = -1;
    }
    if (bVar13 || index < iVar10) {
      *(uint *)(lVar5 + 0xdc) = iVar10 - (uint)(index < iVar10);
    }
  }
  QTabBarPrivate::calculateFirstLastVisible(this_00,index,false,true);
  iVar10 = this_00->currentIndex;
  if (iVar10 != index) {
    if (index < iVar10) {
      setCurrentIndex(this,iVar10 + -1);
    }
    goto LAB_0044f50a;
  }
  this_00->currentIndex = -1;
  uVar12 = (this_00->tabList).d.size;
  if (uVar12 != 0) {
    SVar1 = this_00->selectionBehaviorOnRemove;
    if (SVar1 == SelectLeftTab) {
      local_34 = index + -1;
      piVar9 = &this_00->lastVisible;
      iVar10 = this_00->lastVisible;
      if (local_34 <= iVar10) {
        piVar9 = &local_34;
        iVar10 = local_34;
      }
      bVar13 = SBORROW4(this_00->firstVisible,iVar10);
      iVar10 = this_00->firstVisible - iVar10;
LAB_0044f4ba:
      if (bVar13 == iVar10 < 0) {
        piVar9 = &this_00->firstVisible;
      }
      uVar8 = *piVar9;
LAB_0044f4c7:
      if ((int)uVar8 < 0) goto LAB_0044f4ff;
      uVar11 = (ulong)uVar8;
    }
    else {
      if (SVar1 == SelectRightTab) {
LAB_0044f45b:
        iVar2 = this_00->lastVisible;
        iVar10 = iVar2;
        if (index <= iVar2) {
          iVar10 = index;
        }
        piVar9 = &index_local;
        if (iVar2 < index) {
          piVar9 = &this_00->lastVisible;
        }
        bVar13 = SBORROW4(this_00->firstVisible,iVar10);
        iVar10 = this_00->firstVisible - iVar10;
        goto LAB_0044f4ba;
      }
      if (SVar1 != SelectPreviousTab) goto LAB_0044f4c7;
      uVar8 = uVar8 - (index < (int)uVar8);
      if ((((int)uVar8 < 0) || (uVar11 = (ulong)uVar8, uVar12 <= uVar11)) ||
         (((this_00->tabList).d.ptr[uVar11]->field_0xe4 & 2) == 0)) goto LAB_0044f45b;
    }
    if (uVar11 < uVar12) {
      iVar10 = (this_00->tabList).d.ptr[uVar11]->lastTab;
      setCurrentIndex(this,uVar8);
      (this_00->tabList).d.ptr[uVar11]->lastTab = iVar10;
      goto LAB_0044f50a;
    }
  }
LAB_0044f4ff:
  currentChanged(this,-1);
LAB_0044f50a:
  QTabBarPrivate::refresh(this_00);
  QTabBarPrivate::autoHideTabs(this_00);
  if ((*(int *)&(this_00->super_QWidgetPrivate).field_0x254 <= *(int *)&this_00->field_0x25c) &&
     (*(int *)&this_00->field_0x258 <= *(int *)&this_00->field_0x260)) {
    rect = &(this_00->super_QWidgetPrivate).field_0x254;
    QWidget::update(&this->super_QWidget,(QRect *)rect);
    uVar8 = tabAt(this,&this_00->mousePosition);
    this_00->hoverIndex = uVar8;
    if (((int)uVar8 < 0) || ((ulong)(this_00->tabList).d.size <= (ulong)uVar8)) {
      *(undefined8 *)rect = 0;
      *(undefined8 *)&this_00->field_0x25c = 0xffffffffffffffff;
    }
    else {
      QVar14 = tabRect(this,uVar8);
      *(QRect *)&(this_00->super_QWidgetPrivate).field_0x254 = QVar14;
      QWidget::update(&this->super_QWidget,(QRect *)rect);
    }
  }
  (**(code **)(*(long *)&this->super_QWidget + 0x1b8))(this,index);
  return;
}

Assistant:

void QTabBar::removeTab(int index)
{
    Q_D(QTabBar);
    if (d->validIndex(index)) {
        auto removedTab = d->tabList.at(index);
        if (d->dragInProgress)
            d->moveTabFinished(d->pressedIndex);

#ifndef QT_NO_SHORTCUT
        releaseShortcut(d->tabList.at(index)->shortcutId);
#endif
        if (removedTab->leftWidget) {
            removedTab->leftWidget->hide();
            removedTab->leftWidget->deleteLater();
            removedTab->leftWidget = nullptr;
        }
        if (removedTab->rightWidget) {
            removedTab->rightWidget->hide();
            removedTab->rightWidget->deleteLater();
            removedTab->rightWidget = nullptr;
        }

        int newIndex = removedTab->lastTab;
        d->tabList.removeAt(index);
        delete removedTab;
        for (auto tab : std::as_const(d->tabList)) {
            if (tab->lastTab == index)
                tab->lastTab = -1;
            if (tab->lastTab > index)
                --tab->lastTab;
        }

        d->calculateFirstLastVisible(index, false, true);

        if (index == d->currentIndex) {
            // The current tab is going away, in order to make sure
            // we emit that "current has changed", we need to reset this
            // around.
            d->currentIndex = -1;
            if (d->tabList.size() > 0) {
                switch(d->selectionBehaviorOnRemove) {
                case SelectPreviousTab:
                    if (newIndex > index)
                        newIndex--;
                    if (d->validIndex(newIndex) && d->tabList.at(newIndex)->visible)
                        break;
                    Q_FALLTHROUGH();
                case SelectRightTab:
                    newIndex = qBound(d->firstVisible, index, d->lastVisible);
                    break;
                case SelectLeftTab:
                    newIndex = qBound(d->firstVisible, index-1, d->lastVisible);
                    break;
                default:
                    break;
                }

                if (d->validIndex(newIndex)) {
                    // don't loose newIndex's old through setCurrentIndex
                    int bump = d->tabList.at(newIndex)->lastTab;
                    setCurrentIndex(newIndex);
                    d->tabList.at(newIndex)->lastTab = bump;
                } else {
                    // we had a valid current index, but there are no visible tabs left
                    emit currentChanged(-1);
                }
            } else {
                emit currentChanged(-1);
            }
        } else if (index < d->currentIndex) {
            setCurrentIndex(d->currentIndex - 1);
        }
        d->refresh();
        d->autoHideTabs();
        if (d->hoverRect.isValid()) {
            update(d->hoverRect);
            d->hoverIndex = tabAt(d->mousePosition);
            if (d->validIndex(d->hoverIndex)) {
                d->hoverRect = tabRect(d->hoverIndex);
                update(d->hoverRect);
            } else {
                d->hoverRect = QRect();
            }
        }
        tabRemoved(index);
    }
}